

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  RTCIntersectArguments *pRVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  undefined4 uVar18;
  ulong unaff_R12;
  size_t mask;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar38;
  float fVar39;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar40;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  float fVar57;
  float fVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  float fVar65;
  float fVar66;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar68;
  undefined1 auVar62 [16];
  float fVar67;
  float fVar69;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar96;
  undefined1 auVar88 [16];
  float fVar93;
  float fVar95;
  float fVar97;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar92;
  float fVar94;
  undefined1 auVar91 [64];
  float fVar98;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [16];
  float fVar106;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar114 [16];
  float fVar117;
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar119 [16];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar125 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  int local_abc;
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  ulong local_a78;
  ulong local_a70;
  ulong local_a68;
  NodeRef *local_a60;
  ulong local_a58;
  ulong local_a50;
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  ulong local_a28;
  ulong local_a20;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar11 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar27 = ray->tfar;
    if (0.0 <= fVar27) {
      local_a60 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar3 = (ray->dir).field_0;
      auVar74 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar60._8_4_ = 0x7fffffff;
      auVar60._0_8_ = 0x7fffffff7fffffff;
      auVar60._12_4_ = 0x7fffffff;
      auVar60 = vandps_avx((undefined1  [16])aVar3,auVar60);
      auVar70._8_4_ = 0x219392ef;
      auVar70._0_8_ = 0x219392ef219392ef;
      auVar70._12_4_ = 0x219392ef;
      auVar60 = vcmpps_avx(auVar60,auVar70,1);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = &DAT_3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar70 = vdivps_avx(auVar71,(undefined1  [16])aVar3);
      auVar72._8_4_ = 0x5d5e0b6b;
      auVar72._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar72._12_4_ = 0x5d5e0b6b;
      auVar60 = vblendvps_avx(auVar70,auVar72,auVar60);
      auVar61._0_4_ = auVar60._0_4_ * 0.99999964;
      auVar61._4_4_ = auVar60._4_4_ * 0.99999964;
      auVar61._8_4_ = auVar60._8_4_ * 0.99999964;
      auVar61._12_4_ = auVar60._12_4_ * 0.99999964;
      auVar50._0_4_ = auVar60._0_4_ * 1.0000004;
      auVar50._4_4_ = auVar60._4_4_ * 1.0000004;
      auVar50._8_4_ = auVar60._8_4_ * 1.0000004;
      auVar50._12_4_ = auVar60._12_4_ * 1.0000004;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_a48._4_4_ = uVar1;
      local_a48._0_4_ = uVar1;
      local_a48._8_4_ = uVar1;
      local_a48._12_4_ = uVar1;
      auVar91 = ZEXT1664(local_a48);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar71 = vshufps_avx(auVar61,auVar61,0);
      auVar60 = vmovshdup_avx(auVar61);
      auVar72 = vshufps_avx(auVar61,auVar61,0x55);
      auVar70 = vshufpd_avx(auVar61,auVar61,1);
      auVar7 = vshufps_avx(auVar61,auVar61,0xaa);
      auVar8 = vshufps_avx(auVar50,auVar50,0);
      local_a68 = (ulong)(auVar61._0_4_ < 0.0) << 4;
      auVar61 = vshufps_avx(auVar50,auVar50,0x55);
      auVar50 = vshufps_avx(auVar50,auVar50,0xaa);
      local_a70 = (ulong)(auVar60._0_4_ < 0.0) << 4 | 0x20;
      local_a78 = (ulong)(auVar70._0_4_ < 0.0) << 4 | 0x40;
      uVar19 = local_a68 ^ 0x10;
      local_a58 = local_a70 ^ 0x10;
      local_a20 = local_a78 ^ 0x10;
      auVar60 = vshufps_avx(auVar74,auVar74,0);
      auVar70 = vshufps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),0);
      uVar20 = local_a58;
      local_a50 = uVar19;
      do {
        if (local_a60 == stack) {
          return;
        }
        uVar15 = local_a60[-1].ptr;
        local_a60 = local_a60 + -1;
        do {
          if ((uVar15 & 8) == 0) {
            auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + local_a68),auVar91._0_16_);
            local_8b8 = auVar71._0_4_;
            fStack_8b4 = auVar71._4_4_;
            fStack_8b0 = auVar71._8_4_;
            fStack_8ac = auVar71._12_4_;
            auVar84._0_4_ = auVar74._0_4_ * local_8b8;
            auVar84._4_4_ = auVar74._4_4_ * fStack_8b4;
            auVar84._8_4_ = auVar74._8_4_ * fStack_8b0;
            auVar84._12_4_ = auVar74._12_4_ * fStack_8ac;
            auVar9._4_4_ = uVar1;
            auVar9._0_4_ = uVar1;
            auVar9._8_4_ = uVar1;
            auVar9._12_4_ = uVar1;
            auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + local_a70),auVar9);
            local_8c8 = auVar72._0_4_;
            fStack_8c4 = auVar72._4_4_;
            fStack_8c0 = auVar72._8_4_;
            fStack_8bc = auVar72._12_4_;
            auVar28._0_4_ = auVar74._0_4_ * local_8c8;
            auVar28._4_4_ = auVar74._4_4_ * fStack_8c4;
            auVar28._8_4_ = auVar74._8_4_ * fStack_8c0;
            auVar28._12_4_ = auVar74._12_4_ * fStack_8bc;
            auVar74 = vmaxps_avx(auVar84,auVar28);
            auVar85._4_4_ = uVar2;
            auVar85._0_4_ = uVar2;
            auVar85._8_4_ = uVar2;
            auVar85._12_4_ = uVar2;
            auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + local_a78),auVar85);
            local_8d8 = auVar7._0_4_;
            fStack_8d4 = auVar7._4_4_;
            fStack_8d0 = auVar7._8_4_;
            fStack_8cc = auVar7._12_4_;
            auVar29._0_4_ = auVar84._0_4_ * local_8d8;
            auVar29._4_4_ = auVar84._4_4_ * fStack_8d4;
            auVar29._8_4_ = auVar84._8_4_ * fStack_8d0;
            auVar29._12_4_ = auVar84._12_4_ * fStack_8cc;
            auVar84 = vmaxps_avx(auVar29,auVar60);
            auVar74 = vmaxps_avx(auVar74,auVar84);
            auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar19),auVar91._0_16_);
            local_8e8 = auVar8._0_4_;
            fStack_8e4 = auVar8._4_4_;
            fStack_8e0 = auVar8._8_4_;
            fStack_8dc = auVar8._12_4_;
            auVar30._0_4_ = auVar84._0_4_ * local_8e8;
            auVar30._4_4_ = auVar84._4_4_ * fStack_8e4;
            auVar30._8_4_ = auVar84._8_4_ * fStack_8e0;
            auVar30._12_4_ = auVar84._12_4_ * fStack_8dc;
            auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar20),auVar9);
            local_8f8 = auVar61._0_4_;
            fStack_8f4 = auVar61._4_4_;
            fStack_8f0 = auVar61._8_4_;
            fStack_8ec = auVar61._12_4_;
            auVar41._0_4_ = auVar84._0_4_ * local_8f8;
            auVar41._4_4_ = auVar84._4_4_ * fStack_8f4;
            auVar41._8_4_ = auVar84._8_4_ * fStack_8f0;
            auVar41._12_4_ = auVar84._12_4_ * fStack_8ec;
            auVar84 = vminps_avx(auVar30,auVar41);
            auVar85 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + local_a20),auVar85);
            local_908 = auVar50._0_4_;
            fStack_904 = auVar50._4_4_;
            fStack_900 = auVar50._8_4_;
            fStack_8fc = auVar50._12_4_;
            auVar42._0_4_ = auVar85._0_4_ * local_908;
            auVar42._4_4_ = auVar85._4_4_ * fStack_904;
            auVar42._8_4_ = auVar85._8_4_ * fStack_900;
            auVar42._12_4_ = auVar85._12_4_ * fStack_8fc;
            auVar85 = vminps_avx(auVar42,auVar70);
            auVar84 = vminps_avx(auVar84,auVar85);
            auVar74 = vcmpps_avx(auVar74,auVar84,2);
            uVar18 = vmovmskps_avx(auVar74);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar18);
          }
          if ((uVar15 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar16 = 4;
            }
            else {
              uVar14 = uVar15 & 0xfffffffffffffff0;
              lVar13 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              iVar16 = 0;
              uVar15 = *(ulong *)(uVar14 + lVar13 * 8);
              uVar17 = unaff_R12 - 1 & unaff_R12;
              if (uVar17 != 0) {
                local_a60->ptr = uVar15;
                lVar13 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                uVar12 = uVar17 - 1;
                while( true ) {
                  local_a60 = local_a60 + 1;
                  uVar15 = *(ulong *)(uVar14 + lVar13 * 8);
                  uVar12 = uVar12 & uVar17;
                  if (uVar12 == 0) break;
                  local_a60->ptr = uVar15;
                  lVar13 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                    }
                  }
                  uVar17 = uVar12 - 1;
                }
              }
            }
          }
          else {
            iVar16 = 6;
          }
        } while (iVar16 == 0);
        uVar14 = uVar20;
        if (iVar16 == 6) {
          iVar16 = 0;
          uVar17 = (ulong)((uint)uVar15 & 0xf) - 8;
          bVar21 = uVar17 != 0;
          if (bVar21) {
            uVar15 = uVar15 & 0xfffffffffffffff0;
            local_a28 = 0;
            do {
              lVar13 = local_a28 * 0xb0;
              uVar18 = *(undefined4 *)&(ray->org).field_0;
              auVar31._4_4_ = uVar18;
              auVar31._0_4_ = uVar18;
              auVar31._8_4_ = uVar18;
              auVar31._12_4_ = uVar18;
              uVar18 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar43._4_4_ = uVar18;
              auVar43._0_4_ = uVar18;
              auVar43._8_4_ = uVar18;
              auVar43._12_4_ = uVar18;
              uVar18 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar51._4_4_ = uVar18;
              auVar51._0_4_ = uVar18;
              auVar51._8_4_ = uVar18;
              auVar51._12_4_ = uVar18;
              local_a38 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + lVar13),auVar31);
              auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x10 + lVar13),auVar43);
              auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + lVar13),auVar51);
              auVar85 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x30 + lVar13),auVar31);
              auVar9 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x40 + lVar13),auVar43);
              auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x50 + lVar13),auVar51);
              auVar29 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x60 + lVar13),auVar31);
              auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x70 + lVar13),auVar43);
              auVar41 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x80 + lVar13),auVar51);
              auVar42 = vsubps_avx(auVar29,local_a38);
              auVar22 = vsubps_avx(auVar30,auVar74);
              auVar23 = vsubps_avx(auVar41,auVar84);
              fVar123 = auVar74._0_4_;
              fVar27 = fVar123 + auVar30._0_4_;
              fVar126 = auVar74._4_4_;
              fVar38 = fVar126 + auVar30._4_4_;
              fVar128 = auVar74._8_4_;
              fVar39 = fVar128 + auVar30._8_4_;
              fVar130 = auVar74._12_4_;
              fVar40 = fVar130 + auVar30._12_4_;
              fVar109 = auVar84._0_4_;
              fVar59 = fVar109 + auVar41._0_4_;
              fVar110 = auVar84._4_4_;
              fVar65 = fVar110 + auVar41._4_4_;
              fVar111 = auVar84._8_4_;
              fVar66 = fVar111 + auVar41._8_4_;
              fVar112 = auVar84._12_4_;
              fVar68 = fVar112 + auVar41._12_4_;
              fVar49 = auVar23._0_4_;
              auVar99._0_4_ = fVar27 * fVar49;
              fVar57 = auVar23._4_4_;
              auVar99._4_4_ = fVar38 * fVar57;
              fVar58 = auVar23._8_4_;
              auVar99._8_4_ = fVar39 * fVar58;
              fVar6 = auVar23._12_4_;
              auVar99._12_4_ = fVar40 * fVar6;
              fVar132 = auVar22._0_4_;
              auVar107._0_4_ = fVar132 * fVar59;
              fVar135 = auVar22._4_4_;
              auVar107._4_4_ = fVar135 * fVar65;
              fVar138 = auVar22._8_4_;
              auVar107._8_4_ = fVar138 * fVar66;
              fVar141 = auVar22._12_4_;
              auVar107._12_4_ = fVar141 * fVar68;
              auVar22 = vsubps_avx(auVar107,auVar99);
              fVar86 = local_a38._0_4_;
              fVar98 = fVar86 + auVar29._0_4_;
              fVar92 = local_a38._4_4_;
              fVar104 = fVar92 + auVar29._4_4_;
              fVar94 = local_a38._8_4_;
              fVar105 = fVar94 + auVar29._8_4_;
              fVar96 = local_a38._12_4_;
              fVar106 = fVar96 + auVar29._12_4_;
              fVar118 = auVar42._0_4_;
              auVar62._0_4_ = fVar118 * fVar59;
              fVar120 = auVar42._4_4_;
              auVar62._4_4_ = fVar120 * fVar65;
              fVar121 = auVar42._8_4_;
              auVar62._8_4_ = fVar121 * fVar66;
              fVar122 = auVar42._12_4_;
              auVar62._12_4_ = fVar122 * fVar68;
              auVar108._0_4_ = fVar98 * fVar49;
              auVar108._4_4_ = fVar104 * fVar57;
              auVar108._8_4_ = fVar105 * fVar58;
              auVar108._12_4_ = fVar106 * fVar6;
              auVar42 = vsubps_avx(auVar108,auVar62);
              auVar100._0_4_ = fVar98 * fVar132;
              auVar100._4_4_ = fVar104 * fVar135;
              auVar100._8_4_ = fVar105 * fVar138;
              auVar100._12_4_ = fVar106 * fVar141;
              auVar32._0_4_ = fVar118 * fVar27;
              auVar32._4_4_ = fVar120 * fVar38;
              auVar32._8_4_ = fVar121 * fVar39;
              auVar32._12_4_ = fVar122 * fVar40;
              auVar23 = vsubps_avx(auVar32,auVar100);
              fVar27 = (ray->dir).field_0.m128[2];
              local_a88._4_4_ = (ray->dir).field_0.m128[1];
              fVar38 = (ray->dir).field_0.m128[0];
              local_a98._4_4_ = fVar38;
              local_a98._0_4_ = fVar38;
              local_a98._8_4_ = fVar38;
              local_a98._12_4_ = fVar38;
              local_aa8._0_4_ =
                   fVar38 * auVar22._0_4_ + fVar27 * auVar23._0_4_ + local_a88._4_4_ * auVar42._0_4_
              ;
              local_aa8._4_4_ =
                   fVar38 * auVar22._4_4_ + fVar27 * auVar23._4_4_ + local_a88._4_4_ * auVar42._4_4_
              ;
              local_aa8._8_4_ =
                   fVar38 * auVar22._8_4_ + fVar27 * auVar23._8_4_ + local_a88._4_4_ * auVar42._8_4_
              ;
              local_aa8._12_4_ =
                   fVar38 * auVar22._12_4_ +
                   fVar27 * auVar23._12_4_ + local_a88._4_4_ * auVar42._12_4_;
              auVar74 = vsubps_avx(auVar74,auVar9);
              auVar84 = vsubps_avx(auVar84,auVar28);
              fVar66 = fVar123 + auVar9._0_4_;
              fVar68 = fVar126 + auVar9._4_4_;
              fVar98 = fVar128 + auVar9._8_4_;
              fVar104 = fVar130 + auVar9._12_4_;
              fVar105 = fVar109 + auVar28._0_4_;
              fVar106 = fVar110 + auVar28._4_4_;
              fVar67 = fVar111 + auVar28._8_4_;
              fVar69 = fVar112 + auVar28._12_4_;
              fVar39 = auVar84._0_4_;
              auVar114._0_4_ = fVar66 * fVar39;
              fVar40 = auVar84._4_4_;
              auVar114._4_4_ = fVar68 * fVar40;
              fVar59 = auVar84._8_4_;
              auVar114._8_4_ = fVar98 * fVar59;
              fVar65 = auVar84._12_4_;
              auVar114._12_4_ = fVar104 * fVar65;
              fVar133 = auVar74._0_4_;
              auVar125._0_4_ = fVar133 * fVar105;
              fVar136 = auVar74._4_4_;
              auVar125._4_4_ = fVar136 * fVar106;
              fVar139 = auVar74._8_4_;
              auVar125._8_4_ = fVar139 * fVar67;
              fVar142 = auVar74._12_4_;
              auVar125._12_4_ = fVar142 * fVar69;
              auVar74 = vsubps_avx(auVar125,auVar114);
              auVar84 = vsubps_avx(local_a38,auVar85);
              fVar124 = auVar84._0_4_;
              auVar63._0_4_ = fVar124 * fVar105;
              fVar127 = auVar84._4_4_;
              auVar63._4_4_ = fVar127 * fVar106;
              fVar129 = auVar84._8_4_;
              auVar63._8_4_ = fVar129 * fVar67;
              fVar131 = auVar84._12_4_;
              auVar63._12_4_ = fVar131 * fVar69;
              fVar105 = fVar86 + auVar85._0_4_;
              fVar106 = fVar92 + auVar85._4_4_;
              fVar67 = fVar94 + auVar85._8_4_;
              fVar69 = fVar96 + auVar85._12_4_;
              auVar101._0_4_ = fVar105 * fVar39;
              auVar101._4_4_ = fVar106 * fVar40;
              auVar101._8_4_ = fVar67 * fVar59;
              auVar101._12_4_ = fVar69 * fVar65;
              auVar84 = vsubps_avx(auVar101,auVar63);
              auVar102._8_4_ = 0x7fffffff;
              auVar102._0_8_ = 0x7fffffff7fffffff;
              auVar102._12_4_ = 0x7fffffff;
              auVar88._0_4_ = fVar133 * fVar105;
              auVar88._4_4_ = fVar136 * fVar106;
              auVar88._8_4_ = fVar139 * fVar67;
              auVar88._12_4_ = fVar142 * fVar69;
              auVar33._0_4_ = fVar124 * fVar66;
              auVar33._4_4_ = fVar127 * fVar68;
              auVar33._8_4_ = fVar129 * fVar98;
              auVar33._12_4_ = fVar131 * fVar104;
              auVar42 = vsubps_avx(auVar33,auVar88);
              auVar64._0_4_ =
                   fVar38 * auVar74._0_4_ + fVar27 * auVar42._0_4_ + local_a88._4_4_ * auVar84._0_4_
              ;
              auVar64._4_4_ =
                   fVar38 * auVar74._4_4_ + fVar27 * auVar42._4_4_ + local_a88._4_4_ * auVar84._4_4_
              ;
              auVar64._8_4_ =
                   fVar38 * auVar74._8_4_ + fVar27 * auVar42._8_4_ + local_a88._4_4_ * auVar84._8_4_
              ;
              auVar64._12_4_ =
                   fVar38 * auVar74._12_4_ +
                   fVar27 * auVar42._12_4_ + local_a88._4_4_ * auVar84._12_4_;
              auVar74 = vsubps_avx(auVar85,auVar29);
              fVar87 = auVar85._0_4_ + auVar29._0_4_;
              fVar93 = auVar85._4_4_ + auVar29._4_4_;
              fVar95 = auVar85._8_4_ + auVar29._8_4_;
              fVar97 = auVar85._12_4_ + auVar29._12_4_;
              auVar84 = vsubps_avx(auVar9,auVar30);
              fVar66 = auVar9._0_4_ + auVar30._0_4_;
              fVar68 = auVar9._4_4_ + auVar30._4_4_;
              fVar98 = auVar9._8_4_ + auVar30._8_4_;
              fVar104 = auVar9._12_4_ + auVar30._12_4_;
              auVar85 = vsubps_avx(auVar28,auVar41);
              fVar106 = auVar28._0_4_ + auVar41._0_4_;
              fVar67 = auVar28._4_4_ + auVar41._4_4_;
              fVar69 = auVar28._8_4_ + auVar41._8_4_;
              fVar48 = auVar28._12_4_ + auVar41._12_4_;
              fVar134 = auVar85._0_4_;
              auVar52._0_4_ = fVar134 * fVar66;
              fVar137 = auVar85._4_4_;
              auVar52._4_4_ = fVar137 * fVar68;
              fVar140 = auVar85._8_4_;
              auVar52._8_4_ = fVar140 * fVar98;
              fVar143 = auVar85._12_4_;
              auVar52._12_4_ = fVar143 * fVar104;
              fVar113 = auVar84._0_4_;
              auVar73._0_4_ = fVar113 * fVar106;
              fVar115 = auVar84._4_4_;
              auVar73._4_4_ = fVar115 * fVar67;
              fVar116 = auVar84._8_4_;
              auVar73._8_4_ = fVar116 * fVar69;
              fVar117 = auVar84._12_4_;
              auVar73._12_4_ = fVar117 * fVar48;
              auVar84 = vsubps_avx(auVar73,auVar52);
              fVar105 = auVar74._0_4_;
              auVar44._0_4_ = fVar105 * fVar106;
              fVar106 = auVar74._4_4_;
              auVar44._4_4_ = fVar106 * fVar67;
              fVar67 = auVar74._8_4_;
              auVar44._8_4_ = fVar67 * fVar69;
              fVar69 = auVar74._12_4_;
              auVar44._12_4_ = fVar69 * fVar48;
              auVar74._0_4_ = fVar134 * fVar87;
              auVar74._4_4_ = fVar137 * fVar93;
              auVar74._8_4_ = fVar140 * fVar95;
              auVar74._12_4_ = fVar143 * fVar97;
              auVar74 = vsubps_avx(auVar74,auVar44);
              auVar75._0_4_ = fVar113 * fVar87;
              auVar75._4_4_ = fVar115 * fVar93;
              auVar75._8_4_ = fVar116 * fVar95;
              auVar75._12_4_ = fVar117 * fVar97;
              auVar91 = ZEXT1664(local_a48);
              auVar22._0_4_ = fVar105 * fVar66;
              auVar22._4_4_ = fVar106 * fVar68;
              auVar22._8_4_ = fVar67 * fVar98;
              auVar22._12_4_ = fVar69 * fVar104;
              auVar85 = vsubps_avx(auVar22,auVar75);
              local_a88._0_4_ = local_a88._4_4_;
              fStack_a80 = local_a88._4_4_;
              fStack_a7c = local_a88._4_4_;
              auVar23._0_4_ =
                   fVar38 * auVar84._0_4_ + fVar27 * auVar85._0_4_ + local_a88._4_4_ * auVar74._0_4_
              ;
              auVar23._4_4_ =
                   fVar38 * auVar84._4_4_ + fVar27 * auVar85._4_4_ + local_a88._4_4_ * auVar74._4_4_
              ;
              auVar23._8_4_ =
                   fVar38 * auVar84._8_4_ + fVar27 * auVar85._8_4_ + local_a88._4_4_ * auVar74._8_4_
              ;
              auVar23._12_4_ =
                   fVar38 * auVar84._12_4_ +
                   fVar27 * auVar85._12_4_ + local_a88._4_4_ * auVar74._12_4_;
              auVar119._0_4_ = auVar23._0_4_ + (float)local_aa8._0_4_ + auVar64._0_4_;
              auVar119._4_4_ = auVar23._4_4_ + local_aa8._4_4_ + auVar64._4_4_;
              auVar119._8_4_ = auVar23._8_4_ + local_aa8._8_4_ + auVar64._8_4_;
              auVar119._12_4_ = auVar23._12_4_ + local_aa8._12_4_ + auVar64._12_4_;
              auVar74 = vminps_avx(local_aa8,auVar64);
              auVar74 = vminps_avx(auVar74,auVar23);
              local_ab8 = vandps_avx(auVar119,auVar102);
              auVar53._0_4_ = local_ab8._0_4_ * 1.1920929e-07;
              auVar53._4_4_ = local_ab8._4_4_ * 1.1920929e-07;
              auVar53._8_4_ = local_ab8._8_4_ * 1.1920929e-07;
              auVar53._12_4_ = local_ab8._12_4_ * 1.1920929e-07;
              uVar19 = CONCAT44(auVar53._4_4_,auVar53._0_4_);
              auVar76._0_8_ = uVar19 ^ 0x8000000080000000;
              auVar76._8_4_ = -auVar53._8_4_;
              auVar76._12_4_ = -auVar53._12_4_;
              auVar74 = vcmpps_avx(auVar74,auVar76,5);
              auVar84 = vmaxps_avx(local_aa8,auVar64);
              auVar84 = vmaxps_avx(auVar84,auVar23);
              auVar84 = vcmpps_avx(auVar84,auVar53,2);
              auVar74 = vorps_avx(auVar74,auVar84);
              auVar84 = auVar11 & auVar74;
              if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar84[0xf] < '\0') {
                auVar24._0_4_ = fVar133 * fVar49;
                auVar24._4_4_ = fVar136 * fVar57;
                auVar24._8_4_ = fVar139 * fVar58;
                auVar24._12_4_ = fVar142 * fVar6;
                auVar45._0_4_ = fVar132 * fVar39;
                auVar45._4_4_ = fVar135 * fVar40;
                auVar45._8_4_ = fVar138 * fVar59;
                auVar45._12_4_ = fVar141 * fVar65;
                auVar9 = vsubps_avx(auVar45,auVar24);
                auVar54._0_4_ = fVar113 * fVar39;
                auVar54._4_4_ = fVar115 * fVar40;
                auVar54._8_4_ = fVar116 * fVar59;
                auVar54._12_4_ = fVar117 * fVar65;
                auVar77._0_4_ = fVar133 * fVar134;
                auVar77._4_4_ = fVar136 * fVar137;
                auVar77._8_4_ = fVar139 * fVar140;
                auVar77._12_4_ = fVar142 * fVar143;
                auVar28 = vsubps_avx(auVar77,auVar54);
                auVar84 = vandps_avx(auVar102,auVar24);
                auVar85 = vandps_avx(auVar102,auVar54);
                auVar84 = vcmpps_avx(auVar84,auVar85,1);
                local_808 = vblendvps_avx(auVar28,auVar9,auVar84);
                auVar46._0_4_ = fVar124 * fVar134;
                auVar46._4_4_ = fVar127 * fVar137;
                auVar46._8_4_ = fVar129 * fVar140;
                auVar46._12_4_ = fVar131 * fVar143;
                auVar55._0_4_ = fVar124 * fVar49;
                auVar55._4_4_ = fVar127 * fVar57;
                auVar55._8_4_ = fVar129 * fVar58;
                auVar55._12_4_ = fVar131 * fVar6;
                auVar78._0_4_ = fVar39 * fVar118;
                auVar78._4_4_ = fVar40 * fVar120;
                auVar78._8_4_ = fVar59 * fVar121;
                auVar78._12_4_ = fVar65 * fVar122;
                auVar9 = vsubps_avx(auVar55,auVar78);
                auVar81._0_4_ = fVar39 * fVar105;
                auVar81._4_4_ = fVar40 * fVar106;
                auVar81._8_4_ = fVar59 * fVar67;
                auVar81._12_4_ = fVar65 * fVar69;
                auVar28 = vsubps_avx(auVar81,auVar46);
                auVar84 = vandps_avx(auVar102,auVar78);
                auVar85 = vandps_avx(auVar102,auVar46);
                auVar84 = vcmpps_avx(auVar84,auVar85,1);
                local_7f8 = vblendvps_avx(auVar28,auVar9,auVar84);
                auVar34._0_4_ = fVar133 * fVar105;
                auVar34._4_4_ = fVar136 * fVar106;
                auVar34._8_4_ = fVar139 * fVar67;
                auVar34._12_4_ = fVar142 * fVar69;
                auVar56._0_4_ = fVar133 * fVar118;
                auVar56._4_4_ = fVar136 * fVar120;
                auVar56._8_4_ = fVar139 * fVar121;
                auVar56._12_4_ = fVar142 * fVar122;
                auVar79._0_4_ = fVar124 * fVar132;
                auVar79._4_4_ = fVar127 * fVar135;
                auVar79._8_4_ = fVar129 * fVar138;
                auVar79._12_4_ = fVar131 * fVar141;
                auVar82._0_4_ = fVar124 * fVar113;
                auVar82._4_4_ = fVar127 * fVar115;
                auVar82._8_4_ = fVar129 * fVar116;
                auVar82._12_4_ = fVar131 * fVar117;
                auVar9 = vsubps_avx(auVar56,auVar79);
                auVar28 = vsubps_avx(auVar82,auVar34);
                auVar84 = vandps_avx(auVar102,auVar79);
                auVar85 = vandps_avx(auVar102,auVar34);
                auVar84 = vcmpps_avx(auVar84,auVar85,1);
                local_7e8 = vblendvps_avx(auVar28,auVar9,auVar84);
                fVar49 = local_808._0_4_ * fVar38 +
                         fVar27 * local_7e8._0_4_ + local_7f8._0_4_ * local_a88._4_4_;
                fVar39 = local_808._4_4_ * fVar38 +
                         fVar27 * local_7e8._4_4_ + local_7f8._4_4_ * local_a88._4_4_;
                fVar57 = local_808._8_4_ * fVar38 +
                         fVar27 * local_7e8._8_4_ + local_7f8._8_4_ * local_a88._4_4_;
                fVar27 = local_808._12_4_ * fVar38 +
                         fVar27 * local_7e8._12_4_ + local_7f8._12_4_ * local_a88._4_4_;
                auVar80._0_4_ = fVar49 + fVar49;
                auVar80._4_4_ = fVar39 + fVar39;
                auVar80._8_4_ = fVar57 + fVar57;
                auVar80._12_4_ = fVar27 + fVar27;
                fVar57 = local_808._0_4_ * fVar86 +
                         local_7e8._0_4_ * fVar109 + local_7f8._0_4_ * fVar123;
                fVar40 = local_808._4_4_ * fVar92 +
                         local_7e8._4_4_ * fVar110 + local_7f8._4_4_ * fVar126;
                fVar58 = local_808._8_4_ * fVar94 +
                         local_7e8._8_4_ * fVar111 + local_7f8._8_4_ * fVar128;
                fVar59 = local_808._12_4_ * fVar96 +
                         local_7e8._12_4_ * fVar112 + local_7f8._12_4_ * fVar130;
                auVar84 = vrcpps_avx(auVar80);
                fVar27 = auVar84._0_4_;
                auVar89._0_4_ = auVar80._0_4_ * fVar27;
                fVar38 = auVar84._4_4_;
                auVar89._4_4_ = auVar80._4_4_ * fVar38;
                fVar49 = auVar84._8_4_;
                auVar89._8_4_ = auVar80._8_4_ * fVar49;
                fVar39 = auVar84._12_4_;
                auVar89._12_4_ = auVar80._12_4_ * fVar39;
                auVar103._8_4_ = 0x3f800000;
                auVar103._0_8_ = &DAT_3f8000003f800000;
                auVar103._12_4_ = 0x3f800000;
                auVar84 = vsubps_avx(auVar103,auVar89);
                local_818._0_4_ = (fVar57 + fVar57) * (fVar27 + fVar27 * auVar84._0_4_);
                local_818._4_4_ = (fVar40 + fVar40) * (fVar38 + fVar38 * auVar84._4_4_);
                local_818._8_4_ = (fVar58 + fVar58) * (fVar49 + fVar49 * auVar84._8_4_);
                local_818._12_4_ = (fVar59 + fVar59) * (fVar39 + fVar39 * auVar84._12_4_);
                uVar18 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar83._4_4_ = uVar18;
                auVar83._0_4_ = uVar18;
                auVar83._8_4_ = uVar18;
                auVar83._12_4_ = uVar18;
                auVar84 = vcmpps_avx(auVar83,local_818,2);
                fVar27 = ray->tfar;
                auVar90._4_4_ = fVar27;
                auVar90._0_4_ = fVar27;
                auVar90._8_4_ = fVar27;
                auVar90._12_4_ = fVar27;
                auVar85 = vcmpps_avx(local_818,auVar90,2);
                auVar84 = vandps_avx(auVar84,auVar85);
                auVar91 = ZEXT1664(local_a48);
                auVar85 = vcmpps_avx(auVar80,_DAT_01feba10,4);
                auVar84 = vandps_avx(auVar85,auVar84);
                auVar74 = vandps_avx(auVar74,auVar11);
                auVar84 = vpslld_avx(auVar84,0x1f);
                auVar85 = vpsrad_avx(auVar84,0x1f);
                auVar84 = auVar74 & auVar85;
                if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar84[0xf] < '\0') {
                  auVar74 = vandps_avx(auVar85,auVar74);
                  local_a88 = (long)context->scene;
                  auVar84 = vrcpps_avx(auVar119);
                  fVar27 = auVar84._0_4_;
                  auVar35._0_4_ = auVar119._0_4_ * fVar27;
                  fVar38 = auVar84._4_4_;
                  auVar35._4_4_ = auVar119._4_4_ * fVar38;
                  fVar49 = auVar84._8_4_;
                  auVar35._8_4_ = auVar119._8_4_ * fVar49;
                  fVar39 = auVar84._12_4_;
                  auVar35._12_4_ = auVar119._12_4_ * fVar39;
                  auVar47._8_4_ = 0x3f800000;
                  auVar47._0_8_ = &DAT_3f8000003f800000;
                  auVar47._12_4_ = 0x3f800000;
                  auVar84 = vsubps_avx(auVar47,auVar35);
                  auVar25._0_4_ = fVar27 + fVar27 * auVar84._0_4_;
                  auVar25._4_4_ = fVar38 + fVar38 * auVar84._4_4_;
                  auVar25._8_4_ = fVar49 + fVar49 * auVar84._8_4_;
                  auVar25._12_4_ = fVar39 + fVar39 * auVar84._12_4_;
                  auVar36._8_4_ = 0x219392ef;
                  auVar36._0_8_ = 0x219392ef219392ef;
                  auVar36._12_4_ = 0x219392ef;
                  auVar84 = vcmpps_avx(local_ab8,auVar36,5);
                  auVar84 = vandps_avx(auVar84,auVar25);
                  auVar37._0_4_ = (float)local_aa8._0_4_ * auVar84._0_4_;
                  auVar37._4_4_ = local_aa8._4_4_ * auVar84._4_4_;
                  auVar37._8_4_ = local_aa8._8_4_ * auVar84._8_4_;
                  auVar37._12_4_ = local_aa8._12_4_ * auVar84._12_4_;
                  local_838 = vminps_avx(auVar37,auVar47);
                  auVar26._0_4_ = auVar64._0_4_ * auVar84._0_4_;
                  auVar26._4_4_ = auVar64._4_4_ * auVar84._4_4_;
                  auVar26._8_4_ = auVar64._8_4_ * auVar84._8_4_;
                  auVar26._12_4_ = auVar64._12_4_ * auVar84._12_4_;
                  local_828 = vminps_avx(auVar26,auVar47);
                  uVar18 = vmovmskps_avx(auVar74);
                  uVar20 = CONCAT44((int)(uVar20 >> 0x20),uVar18);
                  do {
                    uVar19 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    h.geomID = *(uint *)(lVar13 + uVar15 + 0x90 + uVar19 * 4);
                    lVar4 = *(long *)(*(long *)(local_a88 + 0x1e8) + (ulong)h.geomID * 8);
                    if ((*(uint *)(lVar4 + 0x34) & ray->mask) == 0) {
                      uVar20 = uVar20 ^ 1L << (uVar19 & 0x3f);
                      bVar10 = true;
                    }
                    else {
                      pRVar5 = context->args;
                      if ((pRVar5->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar4 + 0x48) == 0)) {
                        bVar10 = false;
                      }
                      else {
                        local_a98._0_8_ = uVar17;
                        h.u = *(float *)(local_838 + uVar19 * 4);
                        h.v = *(float *)(local_828 + uVar19 * 4);
                        args.context = context->user;
                        h.primID = *(uint *)(lVar13 + uVar15 + 0xa0 + uVar19 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar19 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar19 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar19 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_aa8._0_4_ = ray->tfar;
                        ray->tfar = *(float *)(local_818 + uVar19 * 4);
                        local_abc = -1;
                        args.valid = &local_abc;
                        args.geometryUserPtr = *(void **)(lVar4 + 0x18);
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (*(code **)(lVar4 + 0x48) == (code *)0x0) {
LAB_002d78ba:
                          if (pRVar5->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               ((*(byte *)(lVar4 + 0x3e) & 0x40) != 0)) {
                              (*pRVar5->filter)(&args);
                              auVar91 = ZEXT1664(local_a48);
                            }
                            if (*args.valid == 0) goto LAB_002d7913;
                          }
                          bVar10 = false;
                        }
                        else {
                          local_ab8._0_8_ = context;
                          local_a38._0_8_ = ray;
                          (**(code **)(lVar4 + 0x48))(&args);
                          auVar91 = ZEXT1664(local_a48);
                          context = (RayQueryContext *)local_ab8._0_8_;
                          ray = (Ray *)local_a38._0_8_;
                          if (*args.valid != 0) goto LAB_002d78ba;
LAB_002d7913:
                          ray->tfar = (float)local_aa8._0_4_;
                          uVar20 = uVar20 ^ 1L << (uVar19 & 0x3f);
                          bVar10 = true;
                        }
                        uVar17 = local_a98._0_8_;
                      }
                    }
                    iVar16 = 0;
                    if (!bVar10) {
                      uVar19 = local_a50;
                      uVar14 = local_a58;
                      if (bVar21) {
                        ray->tfar = -INFINITY;
                        iVar16 = 3;
                      }
                      goto LAB_002d797a;
                    }
                  } while (uVar20 != 0);
                  uVar20 = 0;
                }
              }
              iVar16 = 0;
              local_a28 = local_a28 + 1;
              bVar21 = local_a28 < uVar17;
              uVar19 = local_a50;
              uVar14 = local_a58;
            } while (local_a28 != uVar17);
          }
        }
LAB_002d797a:
        uVar20 = uVar14;
      } while (iVar16 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }